

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O2

string * __thiscall
wallet::CAddressBookData::GetLabel_abi_cxx11_(string *__return_storage_ptr__,CAddressBookData *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->label).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_0015d8a9:
      __stack_chk_fail();
    }
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0015d8a9;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetLabel() const { return label ? *label : std::string{}; }